

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_mail_client.c
# Opt level: O2

int write_ssl_and_get_response(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char code [4];
  uchar data [128];
  
  printf("\n%s");
  if (len == 0) {
LAB_0011035f:
    uVar4 = 0;
    while( true ) {
      do {
        data[0x70] = '\0';
        data[0x71] = '\0';
        data[0x72] = '\0';
        data[0x73] = '\0';
        data[0x74] = '\0';
        data[0x75] = '\0';
        data[0x76] = '\0';
        data[0x77] = '\0';
        data[0x78] = '\0';
        data[0x79] = '\0';
        data[0x7a] = '\0';
        data[0x7b] = '\0';
        data[0x7c] = '\0';
        data[0x7d] = '\0';
        data[0x7e] = '\0';
        data[0x7f] = '\0';
        data[0x60] = '\0';
        data[0x61] = '\0';
        data[0x62] = '\0';
        data[99] = '\0';
        data[100] = '\0';
        data[0x65] = '\0';
        data[0x66] = '\0';
        data[0x67] = '\0';
        data[0x68] = '\0';
        data[0x69] = '\0';
        data[0x6a] = '\0';
        data[0x6b] = '\0';
        data[0x6c] = '\0';
        data[0x6d] = '\0';
        data[0x6e] = '\0';
        data[0x6f] = '\0';
        data[0x50] = '\0';
        data[0x51] = '\0';
        data[0x52] = '\0';
        data[0x53] = '\0';
        data[0x54] = '\0';
        data[0x55] = '\0';
        data[0x56] = '\0';
        data[0x57] = '\0';
        data[0x58] = '\0';
        data[0x59] = '\0';
        data[0x5a] = '\0';
        data[0x5b] = '\0';
        data[0x5c] = '\0';
        data[0x5d] = '\0';
        data[0x5e] = '\0';
        data[0x5f] = '\0';
        data[0x40] = '\0';
        data[0x41] = '\0';
        data[0x42] = '\0';
        data[0x43] = '\0';
        data[0x44] = '\0';
        data[0x45] = '\0';
        data[0x46] = '\0';
        data[0x47] = '\0';
        data[0x48] = '\0';
        data[0x49] = '\0';
        data[0x4a] = '\0';
        data[0x4b] = '\0';
        data[0x4c] = '\0';
        data[0x4d] = '\0';
        data[0x4e] = '\0';
        data[0x4f] = '\0';
        data[0x30] = '\0';
        data[0x31] = '\0';
        data[0x32] = '\0';
        data[0x33] = '\0';
        data[0x34] = '\0';
        data[0x35] = '\0';
        data[0x36] = '\0';
        data[0x37] = '\0';
        data[0x38] = '\0';
        data[0x39] = '\0';
        data[0x3a] = '\0';
        data[0x3b] = '\0';
        data[0x3c] = '\0';
        data[0x3d] = '\0';
        data[0x3e] = '\0';
        data[0x3f] = '\0';
        data[0x20] = '\0';
        data[0x21] = '\0';
        data[0x22] = '\0';
        data[0x23] = '\0';
        data[0x24] = '\0';
        data[0x25] = '\0';
        data[0x26] = '\0';
        data[0x27] = '\0';
        data[0x28] = '\0';
        data[0x29] = '\0';
        data[0x2a] = '\0';
        data[0x2b] = '\0';
        data[0x2c] = '\0';
        data[0x2d] = '\0';
        data[0x2e] = '\0';
        data[0x2f] = '\0';
        data[0x10] = '\0';
        data[0x11] = '\0';
        data[0x12] = '\0';
        data[0x13] = '\0';
        data[0x14] = '\0';
        data[0x15] = '\0';
        data[0x16] = '\0';
        data[0x17] = '\0';
        data[0x18] = '\0';
        data[0x19] = '\0';
        data[0x1a] = '\0';
        data[0x1b] = '\0';
        data[0x1c] = '\0';
        data[0x1d] = '\0';
        data[0x1e] = '\0';
        data[0x1f] = '\0';
        data[0] = '\0';
        data[1] = '\0';
        data[2] = '\0';
        data[3] = '\0';
        data[4] = '\0';
        data[5] = '\0';
        data[6] = '\0';
        data[7] = '\0';
        data[8] = '\0';
        data[9] = '\0';
        data[10] = '\0';
        data[0xb] = '\0';
        data[0xc] = '\0';
        data[0xd] = '\0';
        data[0xe] = '\0';
        data[0xf] = '\0';
        uVar1 = mbedtls_ssl_read(ssl,data,0x7f);
      } while ((uVar1 & 0xffffff7f) == 0xffff9700);
      if (uVar1 == 0xffff8780) {
        return -1;
      }
      if ((int)uVar1 < 1) break;
      printf("\n%s",data);
      for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
        if (data[uVar3] == '\n') {
          if ((uVar4 == 4) && ((byte)(code[0] - 0x30U) < 10)) {
            uVar4 = 0;
            if (code[3] == ' ') {
              code[3] = '\0';
              iVar2 = atoi(code);
              return iVar2;
            }
          }
          else {
            uVar4 = 0;
          }
        }
        else if (uVar4 < 4) {
          code[uVar4] = data[uVar3];
          uVar4 = uVar4 + 1;
        }
      }
    }
    printf("failed\n  ! mbedtls_ssl_read returned %d\n\n",(ulong)uVar1);
  }
  else {
    do {
      uVar1 = mbedtls_ssl_write(ssl,buf,len);
      if (0 < (int)uVar1) goto LAB_0011035f;
    } while ((uVar1 & 0xffffff7f) == 0xffff9700);
    printf(" failed\n  ! mbedtls_ssl_write returned %d\n\n",(ulong)uVar1);
  }
  return -1;
}

Assistant:

static int write_ssl_and_get_response( mbedtls_ssl_context *ssl, unsigned char *buf, size_t len )
{
    int ret;
    unsigned char data[128];
    char code[4];
    size_t i, idx = 0;

    mbedtls_printf("\n%s", buf);
    while( len && ( ret = mbedtls_ssl_write( ssl, buf, len ) ) <= 0 )
    {
        if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_write returned %d\n\n", ret );
            return -1;
        }
    }

    do
    {
        len = sizeof( data ) - 1;
        memset( data, 0, sizeof( data ) );
        ret = mbedtls_ssl_read( ssl, data, len );

        if( ret == MBEDTLS_ERR_SSL_WANT_READ || ret == MBEDTLS_ERR_SSL_WANT_WRITE )
            continue;

        if( ret == MBEDTLS_ERR_SSL_PEER_CLOSE_NOTIFY )
            return -1;

        if( ret <= 0 )
        {
            mbedtls_printf( "failed\n  ! mbedtls_ssl_read returned %d\n\n", ret );
            return -1;
        }

        mbedtls_printf("\n%s", data);
        len = ret;
        for( i = 0; i < len; i++ )
        {
            if( data[i] != '\n' )
            {
                if( idx < 4 )
                    code[ idx++ ] = data[i];
                continue;
            }

            if( idx == 4 && code[0] >= '0' && code[0] <= '9' && code[3] == ' ' )
            {
                code[3] = '\0';
                return atoi( code );
            }

            idx = 0;
        }
    }
    while( 1 );
}